

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::DeepTiledInputFile::Data::~Data(Data *this)

{
  _func_int **pp_Var1;
  TileBuffer *pTVar2;
  long *plVar3;
  _func_int **pp_Var4;
  char *pcVar5;
  pointer ppTVar6;
  pointer ppTVar7;
  ulong uVar8;
  
  if (this->numXTiles != (int *)0x0) {
    operator_delete__(this->numXTiles);
  }
  if (this->numYTiles != (int *)0x0) {
    operator_delete__(this->numYTiles);
  }
  ppTVar6 = (this->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar6) {
    uVar8 = 0;
    do {
      pTVar2 = ppTVar6[uVar8];
      if (pTVar2 != (TileBuffer *)0x0) {
        plVar3 = (long *)(pTVar2->exception)._M_dataplus._M_p;
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
        IlmThread_2_5::Semaphore::~Semaphore((Semaphore *)((long)&(pTVar2->_sem)._semaphore + 0x18))
        ;
        pp_Var4 = (pTVar2->_sem)._vptr_Semaphore;
        pp_Var1 = (_func_int **)((long)&(pTVar2->_sem)._semaphore + 8);
        if (pp_Var4 != pp_Var1) {
          operator_delete(pp_Var4,(ulong)(*pp_Var1 + 1));
        }
        if (*(void **)&pTVar2->dataSize != (void *)0x0) {
          operator_delete__(*(void **)&pTVar2->dataSize);
        }
      }
      operator_delete(pTVar2,0xa0);
      uVar8 = uVar8 + 1;
      ppTVar6 = (this->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->tileBuffers).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6 >> 3))
    ;
  }
  if ((this->multiPartBackwardSupport != false) &&
     (this->multiPartFile != (MultiPartInputFile *)0x0)) {
    (*(this->multiPartFile->super_GenericInputFile)._vptr_GenericInputFile[1])();
  }
  ppTVar7 = (this->slices).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar7) {
    uVar8 = 0;
    do {
      operator_delete(ppTVar7[uVar8],0x40);
      uVar8 = uVar8 + 1;
      ppTVar7 = (this->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->slices).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7 >> 3))
    ;
  }
  if (this->sampleCountTableComp != (Compressor *)0x0) {
    (*this->sampleCountTableComp->_vptr_Compressor[1])();
  }
  pcVar5 = (this->sampleCountTableBuffer)._data;
  if (pcVar5 != (char *)0x0) {
    operator_delete__(pcVar5);
  }
  ppTVar6 = (this->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar6 != (pointer)0x0) {
    operator_delete(ppTVar6,(long)(this->tileBuffers).
                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar6
                   );
  }
  ppTVar7 = (this->slices).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar7 != (pointer)0x0) {
    operator_delete(ppTVar7,(long)(this->slices).
                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar7
                   );
  }
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&(this->tileOffsets)._offsets);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepTiledInputFile::Data::~Data ()
{
    delete [] numXTiles;
    delete [] numYTiles;

    for (size_t i = 0; i < tileBuffers.size(); i++)
        delete tileBuffers[i];

    if (multiPartBackwardSupport)
        delete multiPartFile;

    for (size_t i = 0; i < slices.size(); i++)
        delete slices[i];

    delete sampleCountTableComp;
}